

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void suboption(connectdata *conn)

{
  char cVar1;
  SessionHandle *data;
  char *pcVar2;
  FormData *__s;
  size_t sVar3;
  ssize_t sVar4;
  uint *puVar5;
  undefined8 uVar6;
  ulong length;
  FormData *pFVar7;
  ulong uVar8;
  HTTP *pHVar9;
  char varval [128];
  char varname [128];
  uchar temp [2048];
  
  data = conn->data;
  pHVar9 = (data->state).proto.http;
  printsub(data,0x3c,(uchar *)&pHVar9[0x36].postsize,
           (*(long *)&pHVar9[0x39].sending - pHVar9[0x39].backup.postsize) + 2);
  pcVar2 = (char *)pHVar9[0x39].backup.postsize;
  pHVar9[0x39].backup.postsize = (curl_off_t)(pcVar2 + 1);
  cVar1 = *pcVar2;
  if (cVar1 == '\'') {
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c",0xff,0xfa,0x27,0);
    pFVar7 = pHVar9[0x36].sendit;
    if (pFVar7 == (FormData *)0x0) {
      length = 4;
    }
    else {
      length = 4;
      do {
        __s = pFVar7->next;
        sVar3 = strlen((char *)__s);
        uVar8 = length + sVar3 + 1;
        if (uVar8 < 0x7fa) {
          __isoc99_sscanf(__s,"%127[^,],%127s",varname,varval);
          curl_msnprintf((char *)(temp + length),0x800 - length,"%c%s%c%s",0,varname,1,varval);
          length = uVar8;
        }
        pFVar7 = *(FormData **)&pFVar7->type;
      } while (pFVar7 != (FormData *)0x0);
    }
    curl_msnprintf((char *)(temp + length),0x800 - length,"%c%c",0xff,0xf0);
    sVar4 = send(conn->sock[0],temp,length + 2,0x4000);
    if (sVar4 < 0) {
      puVar5 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar5);
    }
  }
  else {
    if (cVar1 == '#') {
      pHVar9 = pHVar9 + 0x35;
      sVar3 = strlen((char *)pHVar9);
      uVar6 = 0x23;
    }
    else {
      if (cVar1 != '\x18') {
        return;
      }
      pHVar9 = (HTTP *)&pHVar9[0x34].backup.postdata;
      sVar3 = strlen((char *)pHVar9);
      uVar6 = 0x18;
    }
    length = sVar3 + 4;
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,uVar6,0,pHVar9,0xff,0xf0);
    sVar4 = send(conn->sock[0],temp,sVar3 + 6,0x4000);
    if (sVar4 < 0) {
      puVar5 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar5);
    }
  }
  printsub(data,0x3e,temp + 2,length);
  return;
}

Assistant:

static void suboption(struct connectdata *conn)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  size_t tmplen;
  int err;
  char varname[128];
  char varval[128];
  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn)+2);
  switch (CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
               CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
               CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
               CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars;v;v = v->next) {
        tmplen = (strlen(v->data) + 1);
        /* Add the variable only if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          sscanf(v->data, "%127[^,],%127s", varname, varval);
          snprintf((char *)&temp[len], sizeof(temp) - len,
                   "%c%s%c%s", CURL_NEW_ENV_VAR, varname,
                   CURL_NEW_ENV_VALUE, varval);
          len += tmplen;
        }
      }
      snprintf((char *)&temp[len], sizeof(temp) - len,
               "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}